

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O2

void __thiscall xatlas::internal::param::Quality::computeMetrics(Quality *this,Mesh *mesh)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  bool bVar6;
  uint32_t index;
  Vector3 *pVVar7;
  Vector2 *pVVar8;
  Vector3 *pVVar9;
  int iVar10;
  int i;
  uint uVar11;
  long lVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  Vector3 VVar29;
  Vector3 VVar30;
  Vector3 local_1a0;
  uint local_190;
  uint local_18c;
  Vector2 texcoord [3];
  float local_158;
  float fStack_154;
  Vector3 local_128;
  Vector3 pos [3];
  
  this->totalParametricArea = 0.0;
  this->totalGeometricArea = 0.0;
  this->stretchMetric = 0.0;
  this->maxStretchMetric = 0.0;
  this->conformalMetric = 0.0;
  this->authalicMetric = 0.0;
  local_190 = (mesh->m_indices).m_base.size / 3;
  iVar10 = 0;
  for (uVar11 = 0; uVar11 != local_190; uVar11 = uVar11 + 1) {
    pVVar9 = pos;
    local_18c = uVar11;
    for (lVar12 = 0; fVar5 = pos[2].z, fVar4 = pos[1].z, fVar3 = pos[0].z, fVar24 = texcoord[2].y,
        fVar25 = texcoord[2].x, fVar17 = texcoord[1].y, fVar20 = texcoord[1].x,
        fVar22 = texcoord[0].y, fVar26 = texcoord[0].x, uVar11 = local_18c, lVar12 != 3;
        lVar12 = lVar12 + 1) {
      index = Mesh::vertexAt(mesh,(int)lVar12 + iVar10);
      pVVar7 = Array<xatlas::internal::Vector3>::operator[](&mesh->m_positions,index);
      fVar26 = pVVar7->y;
      pVVar9->x = pVVar7->x;
      pVVar9->y = fVar26;
      pVVar9->z = pVVar7->z;
      pVVar8 = Array<xatlas::internal::Vector2>::operator[](&mesh->m_texcoords,index);
      texcoord[lVar12] = *pVVar8;
      pVVar9 = pVVar9 + 1;
    }
    fVar27 = texcoord[1].y - texcoord[0].y;
    fVar28 = texcoord[2].x - texcoord[0].x;
    fVar13 = (fVar27 * fVar28 - (texcoord[1].x - texcoord[0].x) * (texcoord[2].y - texcoord[0].y)) *
             0.5;
    if (1.1920929e-07 < ABS(fVar13)) {
      fVar13 = (float)(~-(uint)(fVar13 < 0.0) & (uint)fVar13 |
                      (uint)ABS(fVar13) & -(uint)(fVar13 < 0.0));
      fVar14 = (float)pos[1]._0_8_;
      fVar18 = SUB84(pos[1]._0_8_,4);
      fVar21 = (float)pos[0]._0_8_;
      fVar23 = SUB84(pos[0]._0_8_,4);
      local_1a0.z = pos[1].z - pos[0].z;
      local_1a0.y = fVar18 - fVar23;
      local_1a0.x = fVar14 - fVar21;
      fVar15 = (float)pos[2]._0_8_;
      fVar19 = SUB84(pos[2]._0_8_,4);
      local_128.z = pos[2].z - pos[0].z;
      local_128.y = fVar19 - fVar23;
      local_128.x = fVar15 - fVar21;
      VVar29 = cross(&local_1a0,&local_128);
      fVar16 = SQRT(VVar29.z * VVar29.z + VVar29.x * VVar29.x + VVar29.y * VVar29.y) * 0.5;
      fVar25 = fVar20 - fVar25;
      fVar26 = fVar26 - fVar20;
      local_1a0.z = fVar5 * fVar26 + fVar28 * fVar4 + fVar3 * fVar25;
      local_1a0.y = fVar26 * fVar19 + fVar28 * fVar18 + fVar25 * fVar23;
      local_1a0.x = fVar26 * fVar15 + fVar28 * fVar14 + fVar25 * fVar21;
      VVar29 = operator/(&local_1a0,fVar13 + fVar13);
      fVar25 = VVar29.z;
      fVar22 = fVar22 - fVar24;
      fVar24 = fVar24 - fVar17;
      local_1a0.z = fVar5 * fVar27 + fVar3 * fVar24 + fVar4 * fVar22;
      local_1a0.y = fVar27 * fVar19 + fVar22 * fVar18 + fVar24 * fVar23;
      local_1a0.x = fVar27 * fVar15 + fVar22 * fVar14 + fVar24 * fVar21;
      VVar30 = operator/(&local_1a0,fVar13 + fVar13);
      fVar17 = VVar30.z;
      fVar26 = VVar30.x;
      fVar20 = VVar30.y;
      local_158 = VVar29.x;
      fStack_154 = VVar29.y;
      fVar24 = fVar25 * fVar17 + local_158 * fVar26 + fStack_154 * fVar20;
      fVar22 = fVar25 * fVar25 + local_158 * local_158 + fStack_154 * fStack_154;
      fVar20 = fVar17 * fVar17 + fVar26 * fVar26 + fVar20 * fVar20;
      fVar26 = fVar22 - fVar20;
      fVar26 = fVar24 * fVar24 * 4.0 + fVar26 * fVar26;
      if (fVar26 < 0.0) {
        fVar17 = sqrtf(fVar26);
      }
      else {
        fVar17 = SQRT(fVar26);
      }
      fVar22 = fVar22 + fVar20;
      fVar20 = 0.0;
      if (0.0 <= fVar22 - fVar17) {
        fVar20 = fVar22 - fVar17;
      }
      fVar20 = fVar20 * 0.5;
      if (fVar20 < 0.0) {
        fVar20 = sqrtf(fVar20);
      }
      else {
        fVar20 = SQRT(fVar20);
      }
      if (fVar26 < 0.0) {
        fVar26 = sqrtf(fVar26);
      }
      else {
        fVar26 = SQRT(fVar26);
      }
      fVar17 = 0.0;
      if (0.0 <= fVar26 + fVar22) {
        fVar17 = fVar26 + fVar22;
      }
      fVar17 = fVar17 * 0.5;
      if (fVar17 < 0.0) {
        fVar17 = sqrtf(fVar17);
      }
      else {
        fVar17 = SQRT(fVar17);
      }
      if (fVar17 <= fVar20) {
        bVar6 = equal(fVar20,fVar17,0.0001);
        if (s_print != (undefined *)0x0 && !bVar6) {
          (*(code *)s_print)("\rASSERT: %s %s %d\n",
                             "sigma2 > sigma1 || equal(sigma1, sigma2, kEpsilon)",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                             ,0x1bb8);
        }
      }
      fVar22 = fVar22 * 0.5;
      if (fVar22 < 0.0) {
        fVar22 = sqrtf(fVar22);
      }
      else {
        fVar22 = SQRT(fVar22);
      }
      fVar26 = (fVar17 * fVar17 + fVar20 * fVar20) * 0.5;
      if (fVar26 < 0.0) {
        fVar26 = sqrtf(fVar26);
      }
      else {
        fVar26 = SQRT(fVar26);
      }
      bVar6 = equal(fVar22,fVar26,0.01);
      if (!bVar6) {
        __assert_fail("equal(rmsStretch, rmsStretch2, 0.01f)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                      ,0x1bbe,"void xatlas::internal::param::Quality::computeMetrics(const Mesh *)")
        ;
      }
      this->stretchMetric = fVar22 * fVar22 * fVar16 + this->stretchMetric;
      fVar26 = this->maxStretchMetric;
      if (this->maxStretchMetric <= fVar17) {
        fVar26 = fVar17;
      }
      this->maxStretchMetric = fVar26;
      if (1e-06 < ABS(fVar20)) {
        this->conformalMetric = (fVar17 / fVar20) * fVar16 + this->conformalMetric;
      }
      this->authalicMetric = fVar20 * fVar17 * fVar16 + this->authalicMetric;
      uVar1 = this->totalParametricArea;
      uVar2 = this->totalGeometricArea;
      this->totalParametricArea = fVar13 + (float)uVar1;
      this->totalGeometricArea = fVar16 + (float)uVar2;
    }
    iVar10 = iVar10 + 3;
  }
  fVar26 = this->totalParametricArea;
  if ((fVar26 < 0.0) || (((uint)fVar26 & 0xfffffffe) == 0x7f800000)) {
    __assert_fail("isFinite(totalParametricArea) && totalParametricArea >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                  ,0x1bcb,"void xatlas::internal::param::Quality::computeMetrics(const Mesh *)");
  }
  fVar22 = this->totalGeometricArea;
  if ((fVar22 < 0.0) || (((uint)fVar22 & 0xfffffffe) == 0x7f800000)) {
    __assert_fail("isFinite(totalGeometricArea) && totalGeometricArea >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                  ,0x1bcc,"void xatlas::internal::param::Quality::computeMetrics(const Mesh *)");
  }
  if (0xfffffffd < (int)this->stretchMetric + 0x807ffffeU) {
    __assert_fail("isFinite(stretchMetric)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                  ,0x1bcd,"void xatlas::internal::param::Quality::computeMetrics(const Mesh *)");
  }
  if (0xfffffffd < (int)this->maxStretchMetric + 0x807ffffeU) {
    __assert_fail("isFinite(maxStretchMetric)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                  ,0x1bce,"void xatlas::internal::param::Quality::computeMetrics(const Mesh *)");
  }
  if (0xfffffffd < (int)this->conformalMetric + 0x807ffffeU) {
    __assert_fail("isFinite(conformalMetric)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                  ,0x1bcf,"void xatlas::internal::param::Quality::computeMetrics(const Mesh *)");
  }
  if ((int)this->authalicMetric + 0x807ffffeU < 0xfffffffe) {
    if (0.0 < fVar22) {
      fVar26 = fVar26 / fVar22;
      if (fVar26 < 0.0) {
        fVar26 = sqrtf(fVar26);
      }
      else {
        fVar26 = SQRT(fVar26);
      }
      fVar22 = this->stretchMetric / this->totalGeometricArea;
      if (fVar22 < 0.0) {
        fVar22 = sqrtf(fVar22);
      }
      else {
        fVar22 = SQRT(fVar22);
      }
      this->stretchMetric = fVar22 * fVar26;
      this->maxStretchMetric = this->maxStretchMetric * fVar26;
      fVar26 = this->conformalMetric / this->totalGeometricArea;
      if (fVar26 < 0.0) {
        fVar26 = sqrtf(fVar26);
      }
      else {
        fVar26 = SQRT(fVar26);
      }
      this->conformalMetric = fVar26;
      fVar26 = this->authalicMetric / this->totalGeometricArea;
      if (fVar26 < 0.0) {
        fVar26 = sqrtf(fVar26);
      }
      else {
        fVar26 = SQRT(fVar26);
      }
      this->authalicMetric = fVar26;
    }
    return;
  }
  __assert_fail("isFinite(authalicMetric)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                ,0x1bd0,"void xatlas::internal::param::Quality::computeMetrics(const Mesh *)");
}

Assistant:

void computeMetrics(const Mesh *mesh)
	{
		totalGeometricArea = totalParametricArea = 0.0f;
		stretchMetric = maxStretchMetric = conformalMetric = authalicMetric = 0.0f;
		const uint32_t faceCount = mesh->faceCount();
		for (uint32_t f = 0; f < faceCount; f++) {
			Vector3 pos[3];
			Vector2 texcoord[3];
			for (int i = 0; i < 3; i++) {
				const uint32_t v = mesh->vertexAt(f * 3 + i);
				pos[i] = mesh->position(v);
				texcoord[i] = mesh->texcoord(v);
			}
			// Evaluate texture stretch metric. See:
			// - "Texture Mapping Progressive Meshes", Sander, Snyder, Gortler & Hoppe
			// - "Mesh Parameterization: Theory and Practice", Siggraph'07 Course Notes, Hormann, Levy & Sheffer.
			const float t1 = texcoord[0].x;
			const float s1 = texcoord[0].y;
			const float t2 = texcoord[1].x;
			const float s2 = texcoord[1].y;
			const float t3 = texcoord[2].x;
			const float s3 = texcoord[2].y;
			float parametricArea = ((s2 - s1) * (t3 - t1) - (s3 - s1) * (t2 - t1)) * 0.5f;
			if (isZero(parametricArea, kAreaEpsilon))
				continue;
			if (parametricArea < 0.0f)
				parametricArea = fabsf(parametricArea);
			const float geometricArea = length(cross(pos[1] - pos[0], pos[2] - pos[0])) / 2;
			const Vector3 Ss = (pos[0] * (t2 - t3) + pos[1] * (t3 - t1) + pos[2] * (t1 - t2)) / (2 * parametricArea);
			const Vector3 St = (pos[0] * (s3 - s2) + pos[1] * (s1 - s3) + pos[2] * (s2 - s1)) / (2 * parametricArea);
			const float a = dot(Ss, Ss); // E
			const float b = dot(Ss, St); // F
			const float c = dot(St, St); // G
										 // Compute eigen-values of the first fundamental form:
			const float sigma1 = sqrtf(0.5f * max(0.0f, a + c - sqrtf(square(a - c) + 4 * square(b)))); // gamma uppercase, min eigenvalue.
			const float sigma2 = sqrtf(0.5f * max(0.0f, a + c + sqrtf(square(a - c) + 4 * square(b)))); // gamma lowercase, max eigenvalue.
			XA_ASSERT(sigma2 > sigma1 || equal(sigma1, sigma2, kEpsilon));
			// isometric: sigma1 = sigma2 = 1
			// conformal: sigma1 / sigma2 = 1
			// authalic: sigma1 * sigma2 = 1
			const float rmsStretch = sqrtf((a + c) * 0.5f);
			const float rmsStretch2 = sqrtf((square(sigma1) + square(sigma2)) * 0.5f);
			XA_DEBUG_ASSERT(equal(rmsStretch, rmsStretch2, 0.01f));
			XA_UNUSED(rmsStretch2);
			stretchMetric += square(rmsStretch) * geometricArea;
			maxStretchMetric = max(maxStretchMetric, sigma2);
			if (!isZero(sigma1, 0.000001f)) {
				// sigma1 is zero when geometricArea is zero.
				conformalMetric += (sigma2 / sigma1) * geometricArea;
			}
			authalicMetric += (sigma1 * sigma2) * geometricArea;
			// Accumulate total areas.
			totalGeometricArea += geometricArea;
			totalParametricArea += parametricArea;
		}
		XA_DEBUG_ASSERT(isFinite(totalParametricArea) && totalParametricArea >= 0);
		XA_DEBUG_ASSERT(isFinite(totalGeometricArea) && totalGeometricArea >= 0);
		XA_DEBUG_ASSERT(isFinite(stretchMetric));
		XA_DEBUG_ASSERT(isFinite(maxStretchMetric));
		XA_DEBUG_ASSERT(isFinite(conformalMetric));
		XA_DEBUG_ASSERT(isFinite(authalicMetric));
		if (totalGeometricArea > 0.0f) {
			const float normFactor = sqrtf(totalParametricArea / totalGeometricArea);
			stretchMetric = sqrtf(stretchMetric / totalGeometricArea) * normFactor;
			maxStretchMetric  *= normFactor;
			conformalMetric = sqrtf(conformalMetric / totalGeometricArea);
			authalicMetric = sqrtf(authalicMetric / totalGeometricArea);
		}
	}